

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * lua_setlocal(lua_State *L,lua_Debug *ar,int n)

{
  ushort uVar1;
  StkId pTVar2;
  GCObject *pGVar3;
  int *piVar4;
  int iVar5;
  char *pcVar6;
  ravi_type_map type;
  StkId pos;
  TString *usertype;
  ravi_type_map local_2c;
  StkId local_28;
  TString *local_20;
  
  local_28 = (StkId)0x0;
  iVar5 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar5 + 1;
  if (iVar5 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                  ,0xd4,"const char *lua_setlocal(lua_State *, const lua_Debug *, int)");
  }
  swapextra(L);
  pcVar6 = findlocal(L,ar->i_ci,n,&local_28,&local_2c,&local_20);
  if (pcVar6 != (char *)0x0) {
    iVar5 = raviV_checktype(L,L->top + -1,local_2c,local_20);
    if (iVar5 != 0) {
      pTVar2 = L->top;
      pGVar3 = pTVar2[-1].value_.gc;
      (local_28->value_).gc = pGVar3;
      uVar1 = pTVar2[-1].tt_;
      local_28->tt_ = uVar1;
      if (((short)uVar1 < 0) &&
         (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
          ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0xdf,"const char *lua_setlocal(lua_State *, const lua_Debug *, int)");
      }
      L->top = L->top + -1;
      goto LAB_0011523a;
    }
  }
  pcVar6 = (char *)0x0;
LAB_0011523a:
  swapextra(L);
  piVar4 = *(int **)&L[-1].hookmask;
  *piVar4 = *piVar4 + -1;
  if (*piVar4 == 0) {
    return pcVar6;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                ,0xe6,"const char *lua_setlocal(lua_State *, const lua_Debug *, int)");
}

Assistant:

LUA_API const char *lua_setlocal (lua_State *L, const lua_Debug *ar, int n) {
  StkId pos = NULL;  /* to avoid warnings */
  const char *name;
  ravi_type_map type;
  TString* usertype;
  int compatible = 1;
  lua_lock(L);
  swapextra(L);
  name = findlocal(L, ar->i_ci, n, &pos, &type, &usertype);
  if (name) {
    /* RAVI extension
    ** We need to ensure that this function does
    ** not subvert the types of local variables
    */
    StkId input = L->top - 1;
    int compatible = raviV_checktype(L, input, type, usertype);
    if (compatible) {
      setobjs2s(L, pos, L->top - 1);
      L->top--;  /* pop value */
    }
    else
      name = NULL;
  }
  swapextra(L);
  lua_unlock(L);
  return name;
}